

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cinatra.cpp
# Opt level: O0

bool __thiscall add_data::before(add_data *this,coro_http_request *req,coro_http_response *res)

{
  char *in_RDX;
  coro_http_request *in_RSI;
  shared_ptr<int> val;
  any *in_stack_ffffffffffffff98;
  coro_http_request *this_00;
  int *in_stack_ffffffffffffffc8;
  
  cinatra::coro_http_request::set_aspect_data<char_const*>(in_RSI,in_RDX);
  this_00 = (coro_http_request *)&stack0xffffffffffffffd8;
  std::make_shared<int,int>(in_stack_ffffffffffffffc8);
  std::any::
  any<std::shared_ptr<int>&,std::shared_ptr<int>,std::any::_Manager_external<std::shared_ptr<int>>,void>
            ((any *)this_00,(shared_ptr<int> *)in_stack_ffffffffffffff98);
  cinatra::coro_http_request::set_user_data(this_00,in_stack_ffffffffffffff98);
  std::any::~any((any *)0x659056);
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x659060);
  return true;
}

Assistant:

bool before(coro_http_request &req, coro_http_response &res) {
    req.set_aspect_data("hello world");
    auto val = std::make_shared<int>(42);
    req.set_user_data(val);
    return true;
  }